

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMaj.c
# Opt level: O3

int Exa_ManMarkup(Exa_Man_t *p)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  bool bVar4;
  long lVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  int (*local_48) [2] [32];
  
  if (0x20 < p->nObjs) {
    __assert_fail("p->nObjs <= MAJ_NOBJS",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcMaj.c"
                  ,0x1c4,"int Exa_ManMarkup(Exa_Man_t *)");
  }
  uVar6 = p->nNodes * 3 + 1;
  p->iVar = uVar6;
  lVar5 = (long)p->nVars;
  if (p->nVars < p->nObjs) {
    local_48 = p->VarMarks + lVar5;
    do {
      lVar7 = 0;
      bVar4 = true;
      do {
        bVar3 = bVar4;
        iVar1 = p->pPars->fFewerVars;
        if (iVar1 == 0) {
LAB_005a3d8d:
          uVar6 = (uint)lVar7 ^ 1;
          if (iVar1 == 0) {
            uVar6 = 0;
          }
          if ((long)(ulong)uVar6 < lVar5 - lVar7) {
            uVar8 = (ulong)uVar6;
            do {
              if (p->iVar < 0) goto LAB_005a3e2d;
              Vec_WecPush(p->vOutLits,(int)uVar8,p->iVar * 2);
              iVar1 = p->iVar;
              p->iVar = iVar1 + 1;
              (*local_48)[lVar7][uVar8] = iVar1;
              uVar8 = uVar8 + 1;
            } while ((long)uVar8 < lVar5 - lVar7);
          }
        }
        else {
          iVar2 = p->nObjs;
          if ((bool)(~bVar3 & 1U | iVar2 + -1 != (int)lVar5)) goto LAB_005a3d8d;
          if (p->iVar < 0) {
LAB_005a3e2d:
            __assert_fail("Var >= 0 && !(c >> 1)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                          ,0x12e,"int Abc_Var2Lit(int, int)");
          }
          Vec_WecPush(p->vOutLits,iVar2 + -2,p->iVar * 2);
          iVar1 = p->iVar;
          p->iVar = iVar1 + 1;
          p->VarMarks[lVar5 + -1][1][(long)iVar2 + 0x1e] = iVar1;
        }
        lVar7 = 1;
        bVar4 = false;
      } while (bVar3);
      lVar5 = lVar5 + 1;
      local_48 = local_48 + 1;
    } while (lVar5 < p->nObjs);
    uVar6 = p->iVar;
  }
  printf("The number of parameter variables = %d.\n",(ulong)uVar6);
  return p->iVar;
}

Assistant:

int Exa_ManMarkup( Exa_Man_t * p )
{
    int i, k, j;
    assert( p->nObjs <= MAJ_NOBJS );
    // assign functionality
    p->iVar = 1 + p->nNodes * 3;
    // assign connectivity variables
    for ( i = p->nVars; i < p->nObjs; i++ )
    {
        for ( k = 0; k < 2; k++ )
        {
            if ( p->pPars->fFewerVars && i == p->nObjs - 1 && k == 0 )
            {
                j = p->nObjs - 2;
                Vec_WecPush( p->vOutLits, j, Abc_Var2Lit(p->iVar, 0) );
                p->VarMarks[i][k][j] = p->iVar++;
                continue;
            }
            for ( j = p->pPars->fFewerVars ? 1 - k : 0; j < i - k; j++ )
            {
                Vec_WecPush( p->vOutLits, j, Abc_Var2Lit(p->iVar, 0) );
                p->VarMarks[i][k][j] = p->iVar++;
            }
        }
    }
    printf( "The number of parameter variables = %d.\n", p->iVar );
    return p->iVar;
    // printout
    for ( i = p->nVars; i < p->nObjs; i++ )
    {
        printf( "Node %d\n", i );
        for ( j = 0; j < p->nObjs; j++ )
        {
            for ( k = 0; k < 2; k++ )
                printf( "%3d ", p->VarMarks[i][k][j] );
            printf( "\n" );
        }
    }
    return p->iVar;
}